

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pem.c
# Opt level: O0

void pem_des3_decrypt(uchar *des3_iv,uchar *buf,size_t buflen,uchar *pwd,size_t pwdlen)

{
  uchar local_1c8 [8];
  uchar des3_key [24];
  mbedtls_des3_context des3_ctx;
  size_t pwdlen_local;
  uchar *pwd_local;
  size_t buflen_local;
  uchar *buf_local;
  uchar *des3_iv_local;
  
  mbedtls_des3_init((mbedtls_des3_context *)(des3_key + 0x10));
  pem_pbkdf1(local_1c8,0x18,des3_iv,pwd,pwdlen);
  mbedtls_des3_set3key_dec((mbedtls_des3_context *)(des3_key + 0x10),local_1c8);
  mbedtls_des3_crypt_cbc((mbedtls_des3_context *)(des3_key + 0x10),0,buflen,des3_iv,buf,buf);
  mbedtls_des3_free((mbedtls_des3_context *)(des3_key + 0x10));
  mbedtls_zeroize(local_1c8,0x18);
  return;
}

Assistant:

static void pem_des3_decrypt( unsigned char des3_iv[8],
                               unsigned char *buf, size_t buflen,
                               const unsigned char *pwd, size_t pwdlen )
{
    mbedtls_des3_context des3_ctx;
    unsigned char des3_key[24];

    mbedtls_des3_init( &des3_ctx );

    pem_pbkdf1( des3_key, 24, des3_iv, pwd, pwdlen );

    mbedtls_des3_set3key_dec( &des3_ctx, des3_key );
    mbedtls_des3_crypt_cbc( &des3_ctx, MBEDTLS_DES_DECRYPT, buflen,
                     des3_iv, buf, buf );

    mbedtls_des3_free( &des3_ctx );
    mbedtls_zeroize( des3_key, 24 );
}